

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O2

float __thiscall Fverb::get_parameter(Fverb *this,uint index)

{
  _Head_base<0UL,_Fverb::BasicDsp_*,_false> _Var1;
  
  if (index < 0xb) {
    _Var1._M_head_impl =
         (this->fDsp)._M_t.
         super___uniq_ptr_impl<Fverb::BasicDsp,_std::default_delete<Fverb::BasicDsp>_>._M_t.
         super__Tuple_impl<0UL,_Fverb::BasicDsp_*,_std::default_delete<Fverb::BasicDsp>_>.
         super__Head_base<0UL,_Fverb::BasicDsp_*,_false>._M_head_impl;
    switch(index) {
    case 0:
      return *(float *)((long)(_Var1._M_head_impl + 0x10007) + 4);
    case 1:
      return *(float *)&_Var1._M_head_impl[5]._vptr_BasicDsp;
    case 2:
      return *(float *)((long)(_Var1._M_head_impl + 0x10009) + 4);
    case 3:
      return *(float *)&_Var1._M_head_impl[0x1000c]._vptr_BasicDsp;
    case 4:
      return *(float *)((long)(_Var1._M_head_impl + 0x1000e) + 4);
    case 5:
      return *(float *)&_Var1._M_head_impl[0x10413]._vptr_BasicDsp;
    case 6:
      return *(float *)&_Var1._M_head_impl[0x11018]._vptr_BasicDsp;
    case 7:
      return *(float *)((long)(_Var1._M_head_impl + 2) + 4);
    case 8:
      return *(float *)(&DAT_00128120 + (long)_Var1._M_head_impl);
    case 9:
      return *(float *)&_Var1._M_head_impl[0x2101b]._vptr_BasicDsp;
    case 10:
      return *(float *)((long)(_Var1._M_head_impl + 0x21019) + 4);
    }
  }
  return 0.0;
}

Assistant:

float Fverb::get_parameter(unsigned index) const noexcept
{
    mydsp &dsp = static_cast<mydsp &>(*fDsp);
    switch (index) {

    case 0:
        return dsp.fHslider2;

    case 1:
        return dsp.fHslider1;

    case 2:
        return dsp.fHslider3;

    case 3:
        return dsp.fHslider4;

    case 4:
        return dsp.fHslider5;

    case 5:
        return dsp.fHslider6;

    case 6:
        return dsp.fHslider7;

    case 7:
        return dsp.fHslider0;

    case 8:
        return dsp.fHslider10;

    case 9:
        return dsp.fHslider9;

    case 10:
        return dsp.fHslider8;

    default:
        (void)dsp;
        return 0;
    }
}